

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O3

nh_bool curses_get_ext_cmd(char *cmd_out,char **namelist,char **desclist,wchar_t listlen)

{
  nh_menuitem_conflict *pnVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  undefined4 *__ptr;
  ulong uVar6;
  size_t __n;
  long lVar7;
  size_t sVar8;
  wchar_t *results;
  char *pcVar9;
  bool bVar10;
  char *pcVar11;
  int iVar12;
  char cVar13;
  ulong uVar14;
  wchar_t wVar15;
  bool bVar16;
  extcmd_hook_args hpa;
  char prompt [128];
  char cbuf [128];
  char buf [256];
  wchar_t local_2c0;
  wchar_t local_2bc;
  nh_menuitem_conflict *local_2a8;
  int local_29c;
  char **local_270;
  char **local_268;
  wchar_t local_260;
  char local_258 [32];
  char local_238 [4];
  undefined1 auStack_234 [124];
  char local_1b8 [128];
  char local_138 [264];
  
  local_270 = namelist;
  local_268 = desclist;
  local_260 = listlen;
  if (settings.extmenu == '\0') {
    hooked_curses_getlin("extended command: (? for help)",cmd_out,ext_cmd_getlin_hook,&local_270);
    cVar13 = *cmd_out;
    pcVar9 = cmd_out;
    if (cVar13 == '\0') {
      bVar16 = true;
    }
    else {
      pcVar11 = cmd_out + 1;
      bVar10 = true;
      do {
        if (cVar13 == '\t') {
          cVar13 = ' ';
        }
        bVar16 = cVar13 == ' ';
        if (!(bool)(bVar10 & bVar16)) {
          *pcVar9 = cVar13;
          pcVar9 = pcVar9 + 1;
        }
        cVar13 = *pcVar11;
        pcVar11 = pcVar11 + 1;
        bVar10 = bVar16;
      } while (cVar13 != '\0');
    }
    pcVar9[-(ulong)(byte)(cmd_out < pcVar9 & bVar16)] = '\0';
    return *cmd_out != '\x1b' && *cmd_out != '\0';
  }
  local_2a8 = (nh_menuitem_conflict *)malloc(0xa78);
  __ptr = (undefined4 *)malloc((long)listlen * 4 + 4);
  local_1b8[0] = '\0';
  uVar6 = (ulong)(uint)listlen;
  local_2bc = L'\n';
  lVar7 = 0;
  local_29c = 0;
LAB_00109d48:
  do {
    iVar5 = (int)lVar7;
    __n = (size_t)iVar5;
    if (listlen < L'\x01') {
      *__ptr = 0xffffffff;
      local_2c0 = L'\0';
    }
    else {
      uVar14 = 0;
      iVar12 = 0;
      do {
        if ((iVar5 == 0) || (iVar2 = strncmp(namelist[uVar14],local_1b8,__n), iVar2 == 0)) {
          lVar7 = (long)iVar12;
          iVar12 = iVar12 + 1;
          __ptr[lVar7] = (int)uVar14;
          sVar8 = strlen(desclist[uVar14]);
          if ((ulong)(long)local_29c < sVar8) {
            local_29c = (int)sVar8;
            sprintf(local_258,"%%-%ds",(ulong)(local_29c + 0xf));
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar6 != uVar14);
      __ptr[iVar12] = 0xffffffff;
      if (iVar12 == 1) {
        uVar14 = 0;
        goto LAB_0010a176;
      }
      uVar14 = 0;
      local_2c0 = L'\0';
      iVar2 = 0;
      wVar4 = L'\0';
      do {
        iVar3 = __ptr[uVar14];
        wVar15 = wVar4;
        if ((long)iVar3 < 0) break;
        pcVar9 = namelist[iVar3];
        wVar15 = (wchar_t)pcVar9[__n];
        if (iVar2 == 0 || wVar4 == wVar15 && 0x11 < iVar12) {
          if (iVar12 < 0x12 || iVar2 == 0) goto LAB_00109f31;
          if (iVar2 == 1) {
            sprintf(local_238,"%s or %s",namelist[(int)__ptr[uVar14 - 1]],pcVar9);
            iVar2 = 1;
          }
          else {
            sVar8 = strlen(local_238);
            builtin_strncpy(local_238 + sVar8," or ",4);
            auStack_234[sVar8] = 0;
            strcat(local_238,pcVar9);
          }
        }
        else {
          sprintf(local_138,local_258,local_238);
          if (local_2bc <= local_2c0) {
            local_2bc = local_2bc * 2;
            local_2a8 = (nh_menuitem_conflict *)realloc(local_2a8,(long)local_2bc * 0x10c);
          }
          pnVar1 = local_2a8 + local_2c0;
          pnVar1->id = wVar4;
          pnVar1->role = MI_NORMAL;
          pnVar1->accel = (char)wVar4;
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_138);
          local_2c0 = local_2c0 + L'\x01';
          iVar3 = __ptr[uVar14];
          iVar2 = 0;
LAB_00109f31:
          sprintf(local_238,"%s [%s]",namelist[iVar3],desclist[iVar3]);
        }
        iVar2 = iVar2 + 1;
        uVar14 = uVar14 + 1;
        wVar4 = wVar15;
      } while (uVar6 != uVar14);
      if (iVar2 != 0) {
        sprintf(local_138,local_258,local_238);
        if (local_2bc <= local_2c0) {
          local_2bc = local_2bc * 2;
          local_2a8 = (nh_menuitem_conflict *)realloc(local_2a8,(long)local_2bc * 0x10c);
        }
        pnVar1 = local_2a8 + local_2c0;
        pnVar1->id = wVar15;
        pnVar1->role = MI_NORMAL;
        pnVar1->accel = (char)wVar15;
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,local_138);
        local_2c0 = local_2c0 + L'\x01';
      }
    }
    results = (wchar_t *)malloc((long)local_2c0 * 4);
    sprintf(local_238,"Extended Command: %s",local_1b8);
    wVar4 = curses_display_menu(local_2a8,local_2c0,local_238,L'\x01',results);
    if (wVar4 == L'\x01') {
      if (0x7e < iVar5) {
        free(results);
        break;
      }
      lVar7 = __n + 1;
      local_1b8[__n] = (char)*results;
      local_1b8[__n + 1] = '\0';
      free(results);
      goto LAB_00109d48;
    }
    free(results);
    lVar7 = 0;
  } while (iVar5 != 0);
  uVar14 = 0xffffffff;
  goto LAB_0010a1ab;
  while (uVar14 = uVar14 + 1, uVar6 != uVar14) {
LAB_0010a176:
    iVar5 = strncmp(namelist[uVar14],local_1b8,__n);
    if (iVar5 == 0) goto LAB_0010a1ab;
  }
  uVar14 = 0;
LAB_0010a1ab:
  free(__ptr);
  free(local_2a8);
  iVar5 = (int)uVar14;
  if (iVar5 != -1) {
    strcpy(cmd_out,namelist[iVar5]);
  }
  return iVar5 != -1;
}

Assistant:

nh_bool curses_get_ext_cmd(char *cmd_out, const char **namelist,
			   const char **desclist, int listlen)
{
	int i;
	struct extcmd_hook_args hpa = {namelist, desclist, listlen};

	if (settings.extmenu) {
	    i = extcmd_via_menu(namelist, desclist, listlen);
	    if (i == -1)
		return FALSE;
	    strcpy(cmd_out, namelist[i]);
	    return TRUE;
	}

	/* maybe a runtime option? */
	hooked_curses_getlin("extended command: (? for help)", cmd_out,
			     ext_cmd_getlin_hook, &hpa);
	mungspaces(cmd_out);
	if (cmd_out[0] == 0 || cmd_out[0] == '\033')
	    return FALSE;
	
	return TRUE;
}